

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall rw::FrameList_::streamWrite(FrameList_ *this,Stream *stream)

{
  Frame *pFVar1;
  int iVar2;
  ulong uVar3;
  int32 i;
  long lVar4;
  int32 i_2;
  int size;
  int32 i_1;
  uint uVar5;
  FrameStreamData buf;
  
  iVar2 = this->numFrames;
  uVar5 = iVar2 * 0x38;
  size = uVar5 + 0x10;
  for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
    iVar2 = PluginList::streamGetSize((PluginList *)&Frame::s_plglist,this->frames[lVar4]);
    size = size + iVar2 + 0xc;
    iVar2 = this->numFrames;
  }
  writeChunkHeader(stream,0xe,size);
  writeChunkHeader(stream,1,uVar5 | 4);
  Stream::writeU32(stream,this->numFrames);
  lVar4 = 0;
  while( true ) {
    uVar3 = (ulong)this->numFrames;
    if ((long)uVar3 <= lVar4) break;
    pFVar1 = this->frames[lVar4];
    buf.right.z = (pFVar1->matrix).right.z;
    buf.right.x = (pFVar1->matrix).right.x;
    buf.right.y = (pFVar1->matrix).right.y;
    buf.up.z = (pFVar1->matrix).up.z;
    buf.up.x = (pFVar1->matrix).up.x;
    buf.up.y = (pFVar1->matrix).up.y;
    buf.at.z = (pFVar1->matrix).at.z;
    buf.at.x = (pFVar1->matrix).at.x;
    buf.at.y = (pFVar1->matrix).at.y;
    buf.pos.z = (pFVar1->matrix).pos.z;
    buf.pos.x = (pFVar1->matrix).pos.x;
    buf.pos.y = (pFVar1->matrix).pos.y;
    buf.parent = findPointer((pFVar1->object).parent,this->frames,this->numFrames);
    buf.matflag = 0;
    Stream::write32(stream,&buf,0x38);
    lVar4 = lVar4 + 1;
  }
  for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    PluginList::streamWrite((PluginList *)&Frame::s_plglist,stream,this->frames[lVar4]);
    uVar3 = (ulong)(uint)this->numFrames;
  }
  return;
}

Assistant:

void
FrameList_::streamWrite(Stream *stream)
{
	FrameStreamData buf;

	int size = 0, structsize = 0;
	structsize = 4 + this->numFrames*sizeof(FrameStreamData);
	size += 12 + structsize;
	for(int32 i = 0; i < this->numFrames; i++)
		size += 12 + Frame::s_plglist.streamGetSize(this->frames[i]);

	writeChunkHeader(stream, ID_FRAMELIST, size);
	writeChunkHeader(stream, ID_STRUCT, structsize);
	stream->writeU32(this->numFrames);
	for(int32 i = 0; i < this->numFrames; i++){
		Frame *f = this->frames[i];
		buf.right = f->matrix.right;
		buf.up = f->matrix.up;
		buf.at = f->matrix.at;
		buf.pos = f->matrix.pos;
		buf.parent = findPointer(f->getParent(), (void**)this->frames,
		                         this->numFrames);
		buf.matflag = 0; //f->matflag;
		stream->write32(&buf, sizeof(buf));
	}
	for(int32 i = 0; i < this->numFrames; i++)
		Frame::s_plglist.streamWrite(stream, this->frames[i]);
}